

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upgrade_memory_model.cpp
# Opt level: O0

void __thiscall
spvtools::opt::UpgradeMemoryModel::UpgradeExtInst(UpgradeMemoryModel *this,Instruction *ext_inst)

{
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> __l_00;
  initializer_list<unsigned_int> init_list_00;
  undefined8 insert_before;
  uint32_t uVar1;
  uint32_t id;
  uint32_t uVar2;
  Analysis preserved_analyses;
  uint32_t uVar3;
  DefUseManager *pDVar4;
  Instruction *pIVar5;
  IRContext *pIVar6;
  TypeManager *pTVar7;
  Type *pTVar8;
  reference ppTVar9;
  allocator<unsigned_int> local_1dd;
  uint local_1dc;
  iterator local_1d8;
  size_type local_1d0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1c8;
  Instruction *local_1b0;
  Instruction *extract_1;
  iterator local_1a0;
  undefined8 local_198;
  SmallVector<unsigned_int,_2UL> local_190;
  allocator<unsigned_int> local_165;
  uint local_164;
  iterator local_160;
  size_type local_158;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_150;
  Instruction *local_138;
  Instruction *extract_0;
  InstructionBuilder builder;
  Instruction *where;
  iterator local_100;
  undefined8 local_f8;
  SmallVector<unsigned_int,_2UL> local_f0;
  undefined4 local_c8;
  uint32_t local_c4;
  GLSLstd450 new_op;
  uint32_t struct_id;
  Struct struct_type;
  undefined1 local_48 [8];
  vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
  element_types;
  uint32_t element_type_id;
  uint32_t pointee_type_id;
  uint32_t ptr_type_id;
  uint32_t ptr_id;
  bool is_modf;
  Instruction *ext_inst_local;
  UpgradeMemoryModel *this_local;
  
  uVar1 = opt::Instruction::GetSingleWordInOperand(ext_inst,1);
  id = opt::Instruction::GetSingleWordInOperand(ext_inst,3);
  pDVar4 = Pass::get_def_use_mgr(&this->super_Pass);
  pIVar5 = analysis::DefUseManager::GetDef(pDVar4,id);
  uVar2 = opt::Instruction::type_id(pIVar5);
  pDVar4 = Pass::get_def_use_mgr(&this->super_Pass);
  pIVar5 = analysis::DefUseManager::GetDef(pDVar4,uVar2);
  uVar2 = opt::Instruction::GetSingleWordInOperand(pIVar5,1);
  element_types.
  super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = opt::Instruction::type_id(ext_inst);
  std::allocator<const_spvtools::opt::analysis::Type_*>::allocator
            ((allocator<const_spvtools::opt::analysis::Type_*> *)
             ((long)&struct_type.element_decorations_._M_t._M_impl.super__Rb_tree_header.
                     _M_node_count + 7));
  std::
  vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
  ::vector((vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
            *)local_48,2,
           (allocator_type *)
           ((long)&struct_type.element_decorations_._M_t._M_impl.super__Rb_tree_header._M_node_count
           + 7));
  std::allocator<const_spvtools::opt::analysis::Type_*>::~allocator
            ((allocator<const_spvtools::opt::analysis::Type_*> *)
             ((long)&struct_type.element_decorations_._M_t._M_impl.super__Rb_tree_header.
                     _M_node_count + 7));
  pIVar6 = Pass::context(&this->super_Pass);
  pTVar7 = IRContext::get_type_mgr(pIVar6);
  pTVar8 = analysis::TypeManager::GetType
                     (pTVar7,element_types.
                             super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
  ppTVar9 = std::
            vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
            ::operator[]((vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                          *)local_48,0);
  *ppTVar9 = pTVar8;
  pIVar6 = Pass::context(&this->super_Pass);
  pTVar7 = IRContext::get_type_mgr(pIVar6);
  pTVar8 = analysis::TypeManager::GetType(pTVar7,uVar2);
  ppTVar9 = std::
            vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
            ::operator[]((vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                          *)local_48,1);
  *ppTVar9 = pTVar8;
  analysis::Struct::Struct
            ((Struct *)&new_op,
             (vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
              *)local_48);
  pIVar6 = Pass::context(&this->super_Pass);
  pTVar7 = IRContext::get_type_mgr(pIVar6);
  local_c4 = analysis::TypeManager::GetTypeInstruction(pTVar7,(Type *)&new_op);
  where._4_4_ = 0x34;
  if (uVar1 == 0x23) {
    where._4_4_ = 0x24;
  }
  local_100 = (iterator)((long)&where + 4);
  local_f8 = 1;
  init_list_00._M_len = 1;
  init_list_00._M_array = local_100;
  local_c8 = where._4_4_;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_f0,init_list_00);
  opt::Instruction::SetOperand(ext_inst,3,&local_f0);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_f0);
  opt::Instruction::RemoveOperand(ext_inst,5);
  opt::Instruction::SetResultType(ext_inst,local_c4);
  builder._24_8_ =
       utils::IntrusiveNodeBase<spvtools::opt::Instruction>::NextNode
                 (&ext_inst->super_IntrusiveNodeBase<spvtools::opt::Instruction>);
  pIVar6 = Pass::context(&this->super_Pass);
  insert_before = builder._24_8_;
  preserved_analyses = opt::operator|(kAnalysisBegin,kAnalysisInstrToBlockMapping);
  InstructionBuilder::InstructionBuilder
            ((InstructionBuilder *)&extract_0,pIVar6,(Instruction *)insert_before,preserved_analyses
            );
  uVar1 = element_types.
          super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
  uVar3 = opt::Instruction::result_id(ext_inst);
  local_164 = 0;
  local_160 = &local_164;
  local_158 = 1;
  std::allocator<unsigned_int>::allocator(&local_165);
  __l_00._M_len = local_158;
  __l_00._M_array = local_160;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_150,__l_00,&local_165);
  pIVar5 = InstructionBuilder::AddCompositeExtract
                     ((InstructionBuilder *)&extract_0,uVar1,uVar3,&local_150);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_150);
  std::allocator<unsigned_int>::~allocator(&local_165);
  local_138 = pIVar5;
  pIVar6 = Pass::context(&this->super_Pass);
  uVar1 = opt::Instruction::result_id(ext_inst);
  uVar3 = opt::Instruction::result_id(local_138);
  IRContext::ReplaceAllUsesWith(pIVar6,uVar1,uVar3);
  pIVar5 = local_138;
  extract_1._4_4_ = opt::Instruction::result_id(ext_inst);
  local_1a0 = (iterator)((long)&extract_1 + 4);
  local_198 = 1;
  init_list._M_len = 1;
  init_list._M_array = local_1a0;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_190,init_list);
  opt::Instruction::SetInOperand(pIVar5,0,&local_190);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_190);
  uVar1 = opt::Instruction::result_id(ext_inst);
  local_1dc = 1;
  local_1d8 = &local_1dc;
  local_1d0 = 1;
  std::allocator<unsigned_int>::allocator(&local_1dd);
  __l._M_len = local_1d0;
  __l._M_array = local_1d8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_1c8,__l,&local_1dd);
  pIVar5 = InstructionBuilder::AddCompositeExtract
                     ((InstructionBuilder *)&extract_0,uVar2,uVar1,&local_1c8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_1c8);
  std::allocator<unsigned_int>::~allocator(&local_1dd);
  local_1b0 = pIVar5;
  uVar1 = opt::Instruction::result_id(pIVar5);
  InstructionBuilder::AddStore((InstructionBuilder *)&extract_0,id,uVar1);
  analysis::Struct::~Struct((Struct *)&new_op);
  std::
  vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
  ::~vector((vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
             *)local_48);
  return;
}

Assistant:

void UpgradeMemoryModel::UpgradeExtInst(Instruction* ext_inst) {
  const bool is_modf = ext_inst->GetSingleWordInOperand(1u) == GLSLstd450Modf;
  auto ptr_id = ext_inst->GetSingleWordInOperand(3u);
  auto ptr_type_id = get_def_use_mgr()->GetDef(ptr_id)->type_id();
  auto pointee_type_id =
      get_def_use_mgr()->GetDef(ptr_type_id)->GetSingleWordInOperand(1u);
  auto element_type_id = ext_inst->type_id();
  std::vector<const analysis::Type*> element_types(2);
  element_types[0] = context()->get_type_mgr()->GetType(element_type_id);
  element_types[1] = context()->get_type_mgr()->GetType(pointee_type_id);
  analysis::Struct struct_type(element_types);
  uint32_t struct_id =
      context()->get_type_mgr()->GetTypeInstruction(&struct_type);
  // Change the operation
  GLSLstd450 new_op = is_modf ? GLSLstd450ModfStruct : GLSLstd450FrexpStruct;
  ext_inst->SetOperand(3u, {static_cast<uint32_t>(new_op)});
  // Remove the pointer argument
  ext_inst->RemoveOperand(5u);
  // Set the type id to the new struct.
  ext_inst->SetResultType(struct_id);

  // The result is now a struct of the original result. The zero'th element is
  // old result and should replace the old result. The one'th element needs to
  // be stored via a new instruction.
  auto where = ext_inst->NextNode();
  InstructionBuilder builder(
      context(), where,
      IRContext::kAnalysisDefUse | IRContext::kAnalysisInstrToBlockMapping);
  auto extract_0 =
      builder.AddCompositeExtract(element_type_id, ext_inst->result_id(), {0});
  context()->ReplaceAllUsesWith(ext_inst->result_id(), extract_0->result_id());
  // The extract's input was just changed to itself, so fix that.
  extract_0->SetInOperand(0u, {ext_inst->result_id()});
  auto extract_1 =
      builder.AddCompositeExtract(pointee_type_id, ext_inst->result_id(), {1});
  builder.AddStore(ptr_id, extract_1->result_id());
}